

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPLoader.cpp
# Opt level: O2

void __thiscall Assimp::HMPImporter::GenerateTextureCoords(HMPImporter *this,uint width,uint height)

{
  aiMesh **ppaVar1;
  aiMesh *paVar2;
  aiVector3D *paVar3;
  uint y;
  uint uVar4;
  uint uVar5;
  
  ppaVar1 = ((this->super_MDLImporter).pScene)->mMeshes;
  if (((ppaVar1 != (aiMesh **)0x0) && (paVar2 = *ppaVar1, paVar2 != (aiMesh *)0x0)) &&
     (paVar3 = paVar2->mTextureCoords[0], paVar3 != (aiVector3D *)0x0)) {
    for (uVar4 = 0; uVar4 != height; uVar4 = uVar4 + 1) {
      for (uVar5 = 0; width != uVar5; uVar5 = uVar5 + 1) {
        paVar3->y = (float)uVar4 *
                    ((1.0 / (float)height) / (float)(height - 1) + 1.0 / (float)height);
        paVar3->x = (float)uVar5 * ((1.0 / (float)width) / (float)(width - 1) + 1.0 / (float)width);
        paVar3->z = 0.0;
        paVar3 = paVar3 + 1;
      }
    }
    return;
  }
  __assert_fail("__null != pScene->mMeshes && __null != pScene->mMeshes[0] && __null != pScene->mMeshes[0]->mTextureCoords[0]"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/HMP/HMPLoader.cpp"
                ,0x1fa,
                "void Assimp::HMPImporter::GenerateTextureCoords(const unsigned int, const unsigned int)"
               );
}

Assistant:

void HMPImporter::GenerateTextureCoords(
    const unsigned int width, const unsigned int height)
{
    ai_assert(NULL != pScene->mMeshes && NULL != pScene->mMeshes[0] &&
              NULL != pScene->mMeshes[0]->mTextureCoords[0]);

    aiVector3D* uv = pScene->mMeshes[0]->mTextureCoords[0];

    const float fY = (1.0f / height) + (1.0f / height) / (height-1);
    const float fX = (1.0f / width) + (1.0f / width) / (width-1);

    for (unsigned int y = 0; y < height;++y)    {
        for (unsigned int x = 0; x < width;++x,++uv)    {
            uv->y = fY*y;
            uv->x = fX*x;
            uv->z = 0.0f;
        }
    }
}